

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O0

void __thiscall
iu_DISABLED_FooP_x_iutest_x_Bar_Test::iu_DISABLED_FooP_x_iutest_x_Bar_Test
          (iu_DISABLED_FooP_x_iutest_x_Bar_Test *this)

{
  iu_DISABLED_FooP_x_iutest_x_Bar_Test *this_local;
  
  FooP::FooP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_DISABLED_FooP_x_iutest_x_Bar_Test_00199180;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_DISABLED_FooP_x_iutest_x_Bar_Test_001991c0;
  return;
}

Assistant:

IUTEST_P(DISABLED_FooP, Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}